

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall crnlib::dynamic_string::trim_crlf(dynamic_string *this)

{
  uint len;
  dynamic_string *pdVar1;
  uint local_18;
  int e;
  int s;
  dynamic_string *this_local;
  
  local_18 = (uint)this->m_len;
  do {
    len = local_18;
    local_18 = len - 1;
    if ((int)local_18 < 1) break;
  } while ((this->m_pStr[(int)local_18] == '\r') || (this->m_pStr[(int)local_18] == '\n'));
  pdVar1 = crop(this,0,len);
  return pdVar1;
}

Assistant:

dynamic_string& dynamic_string::trim_crlf()
    {
        int s = 0, e;

        for (e = m_len - 1; e > s; e--)
        {
            if ((m_pStr[e] != 13) && (m_pStr[e] != 10))
            {
                break;
            }
        }

        return crop(s, e - s + 1);
    }